

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::EndTable(void)

{
  ImVec2 *pIVar1;
  ImVec4 *pIVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  int iVar7;
  ImGuiTable *pIVar8;
  ImGuiWindow *window;
  ImGuiWindow *pIVar9;
  ImGuiTableColumn *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  int iVar13;
  int column_n;
  ulong uVar14;
  ImDrawList *draw_list;
  long lVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec2 local_38;
  
  pIVar11 = GImGui;
  pIVar8 = GImGui->CurrentTable;
  if (pIVar8->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar8);
  }
  uVar17 = pIVar8->Flags;
  window = pIVar8->InnerWindow;
  pIVar9 = pIVar8->OuterWindow;
  if (pIVar8->IsInsideRow == true) {
    TableEndRow(pIVar8);
  }
  if (((uVar17 & 0x20) != 0) && (pIVar8->HoveredColumnBody != -1)) {
    bVar12 = IsAnyItemHovered();
    if (!bVar12) {
      bVar12 = IsMouseReleased(1);
      if (bVar12) {
        TableOpenContextMenu((int)pIVar8->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar8->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar8->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar8->HostBackupCursorMaxPos;
  fVar3 = pIVar8->RowPosY2;
  if (window == pIVar9) {
    if ((uVar17 >> 0x11 & 1) == 0) {
      fVar21 = (pIVar8->OuterRect).Max.y;
      uVar16 = -(uint)(fVar3 <= fVar21);
      fVar21 = (float)(~uVar16 & (uint)fVar3 | (uint)fVar21 & uVar16);
      (pIVar8->InnerRect).Max.y = fVar21;
      (pIVar8->OuterRect).Max.y = fVar21;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar3;
  }
  fVar21 = (pIVar8->WorkRect).Max.y;
  fVar20 = (pIVar8->OuterRect).Max.y;
  uVar16 = -(uint)(fVar20 <= fVar21);
  (pIVar8->WorkRect).Max.y = (float)(~uVar16 & (uint)fVar20 | (uint)fVar21 & uVar16);
  pIVar8->LastOuterHeight = fVar20 - (pIVar8->OuterRect).Min.y;
  if (((uint)pIVar8->Flags >> 0x18 & 1) != 0) {
    fVar21 = (pIVar8->InnerWindow->DC).CursorMaxPos.x;
    if ((long)pIVar8->RightMostEnabledColumn != -1) {
      fVar20 = 0.0;
      if (((uint)pIVar8->Flags >> 10 & 1) != 0) {
        fVar20 = 1.0;
      }
      fVar20 = ((pIVar8->Columns).Data[pIVar8->RightMostEnabledColumn].WorkMaxX +
                pIVar8->CellPaddingX + pIVar8->OuterPaddingX) - fVar20;
      uVar16 = -(uint)(fVar20 <= fVar21);
      fVar21 = (float)(uVar16 & (uint)fVar21 | ~uVar16 & (uint)fVar20);
    }
    if (pIVar8->ResizedColumn != -1) {
      uVar16 = -(uint)(pIVar8->ResizeLockMinContentsX2 <= fVar21);
      fVar21 = (float)((uint)fVar21 & uVar16 | ~uVar16 & (uint)pIVar8->ResizeLockMinContentsX2);
    }
    (pIVar8->InnerWindow->DC).CursorMaxPos.x = fVar21;
  }
  if ((uVar17 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  draw_list = window->DrawList;
  pIVar2 = (draw_list->_ClipRectStack).Data + (long)(draw_list->_ClipRectStack).Size + -1;
  fVar21 = pIVar2->y;
  fVar20 = pIVar2->z;
  fVar18 = pIVar2->w;
  (window->ClipRect).Min.x = pIVar2->x;
  (window->ClipRect).Min.y = fVar21;
  (window->ClipRect).Max.x = fVar20;
  (window->ClipRect).Max.y = fVar18;
  if ((uVar17 & 0x780) != 0) {
    TableDrawBorders(pIVar8);
    draw_list = window->DrawList;
  }
  ImDrawListSplitter::SetCurrentChannel(&pIVar8->DrawSplitter,draw_list,0);
  if ((pIVar8->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar8);
  }
  ImDrawListSplitter::Merge(&pIVar8->DrawSplitter,window->DrawList);
  fVar21 = pIVar8->CellPaddingX + pIVar8->CellPaddingX;
  fVar20 = (float)(int)pIVar8->ColumnsEnabledCount * fVar21 +
           pIVar8->OuterPaddingX + pIVar8->OuterPaddingX +
           (float)(pIVar8->ColumnsEnabledCount + -1) *
           (pIVar8->CellSpacingX1 + pIVar8->CellSpacingX2);
  pIVar8->ColumnsAutoFitWidth = fVar20;
  iVar7 = pIVar8->ColumnsCount;
  lVar15 = 0;
  for (uVar14 = 0; (long)uVar14 < (long)iVar7; uVar14 = uVar14 + 1) {
    if ((pIVar8->EnabledMaskByIndex >> (uVar14 & 0x3f) & 1) != 0) {
      pIVar10 = (pIVar8->Columns).Data;
      if ((*(uint *)((long)&pIVar10->Flags + lVar15) & 0x18) == 8) {
        fVar18 = *(float *)((long)&pIVar10->WidthRequest + lVar15);
      }
      else {
        fVar18 = TableGetColumnWidthAuto
                           (pIVar8,(ImGuiTableColumn *)((long)&pIVar10->Flags + lVar15));
      }
      fVar20 = fVar20 + fVar18;
      pIVar8->ColumnsAutoFitWidth = fVar20;
    }
    lVar15 = lVar15 + 0x68;
  }
  if ((window == pIVar9) || ((pIVar8->Flags & 0x1000000U) != 0)) {
    if (((long)pIVar8->LastResizedColumn != -1) &&
       (((pIVar8->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar8->InstanceInteracted == pIVar8->InstanceCurrent)))) {
      fVar21 = fVar21 + pIVar8->MinColumnWidth;
      fVar20 = (pIVar8->Columns).Data[pIVar8->LastResizedColumn].MaxX;
      if ((pIVar8->InnerClipRect).Min.x <= fVar20) {
        pIVar1 = &(pIVar8->InnerClipRect).Max;
        if (fVar20 < pIVar1->x || fVar20 == pIVar1->x) goto LAB_001f5d54;
        fVar21 = fVar21 + (fVar20 - (window->Pos).x);
      }
      else {
        fVar21 = (fVar20 - (window->Pos).x) - fVar21;
      }
      SetScrollFromPosX(window,fVar21,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001f5d54:
  if (((long)pIVar8->ResizedColumn != -1) && (pIVar8->InstanceCurrent == pIVar8->InstanceInteracted)
     ) {
    pIVar8->ResizedColumnNextWidth =
         (float)(int)((((((pIVar11->IO).MousePos.x - (pIVar11->ActiveIdClickOffset).x) + 4.0) -
                       (pIVar8->Columns).Data[pIVar8->ResizedColumn].MinX) - pIVar8->CellSpacingX1)
                     - (pIVar8->CellPaddingX + pIVar8->CellPaddingX));
  }
  PopID();
  fVar21 = (pIVar9->DC).CursorMaxPos.x;
  fVar20 = (pIVar9->DC).CursorMaxPos.y;
  IVar5 = (pIVar8->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar8->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar5;
  IVar5 = (pIVar8->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar8->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar5;
  window->SkipItems = pIVar8->HostSkipItems;
  (pIVar9->DC).CursorPos = (pIVar8->OuterRect).Min;
  (pIVar9->DC).ItemWidth = pIVar8->HostBackupItemWidth;
  (pIVar9->DC).ItemWidthStack.Size = pIVar8->HostBackupItemWidthStackSize;
  (pIVar9->DC).ColumnsOffset.x = (pIVar8->HostBackupColumnsOffset).x;
  if (window == pIVar9) {
    IVar5 = (pIVar8->OuterRect).Min;
    IVar6 = (pIVar8->OuterRect).Max;
    local_38.x = IVar6.x - IVar5.x;
    local_38.y = IVar6.y - IVar5.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar8->OuterRect,0,(ImRect *)0x0);
  }
  else {
    EndChild();
  }
  uVar17 = pIVar8->Flags;
  if ((uVar17 >> 0x10 & 1) == 0) {
    fVar18 = (pIVar8->UserOuterSize).x;
    fVar19 = 0.0;
    if (fVar18 <= 0.0) {
      if ((uVar17 >> 0x18 & 1) != 0) {
        fVar19 = (window->ScrollbarSizes).x;
      }
      fVar22 = (pIVar8->OuterRect).Min.x + pIVar8->ColumnsAutoFitWidth;
      fVar4 = (pIVar9->DC).IdealMaxPos.x;
      fVar18 = (fVar19 + fVar22) - fVar18;
      uVar16 = -(uint)(fVar18 <= fVar4);
      (pIVar9->DC).IdealMaxPos.x = (float)(uVar16 & (uint)fVar4 | ~uVar16 & (uint)fVar18);
      fVar18 = (pIVar8->OuterRect).Max.x;
      if (fVar22 <= fVar18) {
        fVar18 = fVar22;
      }
    }
    else {
      fVar18 = (pIVar8->OuterRect).Max.x;
    }
  }
  else {
    fVar18 = (pIVar8->OuterRect).Min.x + pIVar8->ColumnsAutoFitWidth;
  }
  uVar16 = -(uint)(fVar18 <= fVar21);
  (pIVar9->DC).CursorMaxPos.x = (float)(~uVar16 & (uint)fVar18 | (uint)fVar21 & uVar16);
  fVar21 = (pIVar8->UserOuterSize).y;
  fVar18 = 0.0;
  if (fVar21 <= 0.0) {
    if ((uVar17 >> 0x19 & 1) != 0) {
      fVar18 = (window->ScrollbarSizes).y;
    }
    fVar19 = (pIVar9->DC).IdealMaxPos.y;
    fVar21 = (fVar18 + fVar3) - fVar21;
    uVar17 = -(uint)(fVar21 <= fVar19);
    (pIVar9->DC).IdealMaxPos.y = (float)(uVar17 & (uint)fVar19 | ~uVar17 & (uint)fVar21);
    fVar21 = (pIVar8->OuterRect).Max.y;
    if (fVar3 <= fVar21) {
      fVar21 = fVar3;
    }
  }
  else {
    fVar21 = (pIVar8->OuterRect).Max.y;
  }
  uVar17 = -(uint)(fVar21 <= fVar20);
  (pIVar9->DC).CursorMaxPos.y = (float)(~uVar17 & (uint)fVar21 | (uint)fVar20 & uVar17);
  if (pIVar8->IsSettingsDirty == true) {
    TableSaveSettings(pIVar8);
  }
  pIVar8->IsInitializing = false;
  iVar7 = (pIVar11->CurrentTableStack).Size;
  iVar13 = iVar7 + -1;
  (pIVar11->CurrentTableStack).Size = iVar13;
  if (iVar13 == 0) {
    pIVar11->CurrentTable = (ImGuiTable *)0x0;
    uVar17 = 0xffffffff;
  }
  else {
    pIVar8 = (pIVar11->Tables).Buf.Data;
    uVar17 = (pIVar11->CurrentTableStack).Data[(long)iVar7 + -2].Index;
    pIVar11->CurrentTable = pIVar8 + (int)uVar17;
    uVar17 = -(uint)(pIVar8 == (ImGuiTable *)0x0) | uVar17;
  }
  (pIVar9->DC).CurrentTableIdx = uVar17;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = table->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = table->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = table->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    table->DrawSplitter.Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= table->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = table->HostBackupWorkRect;
    inner_window->ParentWorkRect = table->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = table->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = table->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = table->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (table->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - table->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (table->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - table->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    g.CurrentTableStack.pop_back();
    g.CurrentTable = g.CurrentTableStack.Size ? g.Tables.GetByIndex(g.CurrentTableStack.back().Index) : NULL;
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}